

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O1

h__Reader * __thiscall AS_02::JXS::MXFReader::h__Reader::OpenRead(h__Reader *this,string *filename)

{
  list *plVar1;
  long *****ppppplVar2;
  ILogSink *pIVar3;
  long *****ppppplVar4;
  InterchangeObject *tmp_iobj;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t result;
  long ****local_240;
  long ****local_238;
  undefined8 local_230;
  undefined1 local_228 [208];
  Result_t local_158 [104];
  Result_t local_f0 [104];
  Result_t local_88 [104];
  
  h__AS02Reader::OpenMXFRead((h__AS02Reader *)local_228,filename);
  if (-1 < (int)local_228._0_4_) {
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    plVar1 = (list *)(&(filename->field_2)._M_allocated_capacity + 1);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_88,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_88);
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_f0,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_f0);
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"RGBAEssenceDescriptor nor CDCIEssenceDescriptor found.\n");
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType((uchar *)local_158,(InterchangeObject **)plVar1);
    Kumu::Result_t::~Result_t(local_158);
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"JPEGXSPictureSubDescriptor not found.\n");
    local_240 = (long ****)&local_240;
    local_230 = 0;
    local_238 = local_240;
    ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
    ASDCP::MXF::OP1aHeader::GetMDObjectsByType(local_228 + 0x68,plVar1);
    Kumu::Result_t::~Result_t((Result_t *)(local_228 + 0x68));
    ppppplVar4 = (long *****)local_240;
    if ((long *****)local_240 == &local_240) {
      pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar3,"MXF Metadata contains no Track Sets.\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)RESULT_AS02_FORMAT);
      ppppplVar4 = (long *****)local_240;
      while (ppppplVar4 != &local_240) {
        ppppplVar2 = (long *****)*ppppplVar4;
        operator_delete(ppppplVar4,0x18);
        ppppplVar4 = ppppplVar2;
      }
      goto LAB_00147766;
    }
    do {
      ppppplVar2 = (long *****)*ppppplVar4;
      operator_delete(ppppplVar4,0x18);
      ppppplVar4 = ppppplVar2;
    } while (ppppplVar2 != &local_240);
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)local_228);
LAB_00147766:
  Kumu::Result_t::~Result_t((Result_t *)local_228);
  return this;
}

Assistant:

Result_t
AS_02::JXS::MXFReader::h__Reader::OpenRead(const std::string& filename)
{
  Result_t result = OpenMXFRead(filename);

  if( KM_SUCCESS(result) )
    {
      InterchangeObject* tmp_iobj = 0;

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(CDCIEssenceDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(RGBAEssenceDescriptor), &tmp_iobj);
	}

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("RGBAEssenceDescriptor nor CDCIEssenceDescriptor found.\n");
	}

      m_HeaderPart.GetMDObjectByType(OBJ_TYPE_ARGS(JPEGXSPictureSubDescriptor), &tmp_iobj);

      if ( tmp_iobj == 0 )
	{
	  DefaultLogSink().Error("JPEGXSPictureSubDescriptor not found.\n");
	}

      std::list<InterchangeObject*> ObjectList;
      m_HeaderPart.GetMDObjectsByType(OBJ_TYPE_ARGS(Track), ObjectList);

      if ( ObjectList.empty() )
	{
	  DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
	  return RESULT_AS02_FORMAT;
	}
    }

  return result;
}